

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::CheckAssertReturnResult
          (CommandRunner *this,AssertReturnCommand *command,int index,ExpectedValue expected,
          TypedValue actual,bool print_error)

{
  uint32_t uVar1;
  f64 fVar2;
  ExpectedValue expected_00;
  TypedValue actual_00;
  AssertReturnCommand *command_00;
  bool bVar3;
  Enum EVar4;
  Enum EVar5;
  u32 uVar6;
  u32 uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  u64 uVar11;
  u64 uVar12;
  unsigned_long uVar13;
  unsigned_long uVar14;
  undefined8 uVar15;
  ExpectedValue *extraout_RDX;
  ExpectedValue *extraout_RDX_00;
  ExpectedValue *extraout_RDX_01;
  ExpectedValue *extraout_RDX_02;
  ExpectedValue *extraout_RDX_03;
  ExpectedValue *extraout_RDX_04;
  ExpectedValue *extraout_RDX_05;
  ExpectedValue *extraout_RDX_06;
  ExpectedValue *extraout_RDX_07;
  ExpectedValue *extraout_RDX_08;
  ExpectedValue *ev;
  ExpectedValue *extraout_RDX_09;
  ExpectedValue *extraout_RDX_10;
  ExpectedValue *pEVar16;
  f32 fVar17;
  undefined1 auVar18 [16];
  bool local_199;
  string local_198;
  string local_178;
  size_t local_158;
  Ref local_150;
  string local_148;
  string local_128;
  undefined1 local_108 [16];
  u64 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  Enum local_b0;
  Enum local_ac;
  undefined1 local_a8 [8];
  TypedValue lane_actual;
  ExpectedValue lane_expected;
  f64 fStack_48;
  int lane;
  f64 local_40;
  f32 local_38;
  f32 local_34;
  byte local_2d;
  Enum local_2c;
  bool ok;
  uint local_24;
  bool print_error_local;
  AssertReturnCommand *pAStack_20;
  int index_local;
  AssertReturnCommand *command_local;
  CommandRunner *this_local;
  
  ok = print_error;
  local_24 = index;
  pAStack_20 = command;
  command_local = (AssertReturnCommand *)this;
  EVar4 = wabt::Type::operator_cast_to_Enum((Type *)&expected);
  EVar5 = wabt::Type::operator_cast_to_Enum(&actual.type);
  local_199 = true;
  if (EVar4 != EVar5) {
    local_2c = expected.value.type.enum_;
    local_199 = wabt::interp::IsReference(expected.value.type);
  }
  if (local_199 != false) {
    local_2d = 1;
    EVar4 = wabt::Type::operator_cast_to_Enum((Type *)&expected);
    pEVar16 = extraout_RDX;
    switch(EVar4) {
    case ExternRef:
      local_150 = wabt::interp::Value::Get<wabt::interp::Ref>(&expected.value.value);
      local_158 = (size_t)wabt::interp::Value::Get<wabt::interp::Ref>(&actual.value);
      local_2d = wabt::interp::operator==(local_150,(Ref)local_158);
      pEVar16 = extraout_RDX_10;
      break;
    case FuncRef:
      EVar4 = wabt::Type::operator_cast_to_Enum(&actual.type);
      local_2d = EVar4 == FuncRef;
      pEVar16 = extraout_RDX_09;
      break;
    default:
      abort();
    case I16:
    case I8:
    case I32:
      uVar6 = wabt::interp::Value::Get<unsigned_int>(&expected.value.value);
      uVar7 = wabt::interp::Value::Get<unsigned_int>(&actual.value);
      local_2d = uVar6 == uVar7;
      pEVar16 = extraout_RDX_00;
      break;
    case V128:
      lane_expected._52_4_ = 0;
      while( true ) {
        iVar10 = LaneCountFromType(expected.lane_type);
        pEVar16 = extraout_RDX_08;
        if (iVar10 <= (int)lane_expected._52_4_) break;
        GetLane((ExpectedValue *)&lane_actual.value.type,&expected,lane_expected._52_4_);
        local_ac = expected.lane_type.enum_;
        GetLane((TypedValue *)local_a8,&actual,expected.lane_type,lane_expected._52_4_);
        command_00 = pAStack_20;
        uVar8 = local_24;
        memcpy(&local_e8,&lane_actual.value.type,0x38);
        local_108._0_8_ = local_a8;
        local_108._8_8_ = lane_actual._0_8_;
        local_f8 = lane_actual.value.field_0.i64_;
        uStack_f0 = lane_actual.value.field_0._8_8_;
        expected_00.value.value.field_0.i64_ = uStack_e0;
        expected_00.value._0_8_ = local_e8;
        expected_00.value.value.field_0._8_8_ = local_d8;
        expected_00.value.value._16_8_ = uStack_d0;
        expected_00.lane_type.enum_ = (undefined4)local_c8;
        expected_00.nan[0] = local_c8._4_4_;
        expected_00.nan[1] = (undefined4)uStack_c0;
        expected_00.nan[2] = uStack_c0._4_4_;
        expected_00._48_8_ = local_b8;
        actual_00.value.field_0.i64_ = lane_actual._0_8_;
        actual_00._0_8_ = local_a8;
        actual_00.value.field_0._8_8_ = lane_actual.value.field_0.i64_;
        actual_00.value._16_8_ = lane_actual.value.field_0._8_8_;
        local_b0 = (Enum)CheckAssertReturnResult(this,command_00,uVar8,expected_00,actual_00,false);
        bVar3 = wabt::Failed((Result)local_b0);
        uVar8 = local_24;
        if (bVar3) {
          uVar1 = (pAStack_20->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
          ExpectedValueToString_abi_cxx11_(&local_128,(spectest *)&lane_actual.value.type,ev);
          auVar18 = std::__cxx11::string::c_str();
          wabt::interp::TypedValueToString_abi_cxx11_(&local_148,(interp *)local_a8,auVar18._8_8_);
          uVar15 = std::__cxx11::string::c_str();
          PrintError(this,uVar1,
                     "mismatch in lane %u of result %u of assert_return: expected %s, got %s",
                     (ulong)(uint)lane_expected._52_4_,(ulong)uVar8,auVar18._0_8_,uVar15);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_128);
          local_2d = 0;
        }
        lane_expected._52_4_ = lane_expected._52_4_ + 1;
      }
      break;
    case F64:
      if (expected.nan[0] == None) {
        local_40 = wabt::interp::Value::Get<double>(&expected.value.value);
        uVar13 = wabt::Bitcast<unsigned_long,double>((double *)&local_40);
        fStack_48 = wabt::interp::Value::Get<double>(&actual.value);
        uVar14 = wabt::Bitcast<unsigned_long,double>((double *)&stack0xffffffffffffffb8);
        local_2d = uVar13 == uVar14;
        pEVar16 = extraout_RDX_07;
      }
      else if (expected.nan[0] == Canonical) {
        fVar2 = wabt::interp::Value::Get<double>(&actual.value);
        local_2d = IsCanonicalNan(fVar2);
        pEVar16 = extraout_RDX_06;
      }
      else if (expected.nan[0] == Arithmetic) {
        fVar2 = wabt::interp::Value::Get<double>(&actual.value);
        local_2d = IsArithmeticNan(fVar2);
        pEVar16 = extraout_RDX_05;
      }
      break;
    case F32:
      if (expected.nan[0] == None) {
        local_34 = wabt::interp::Value::Get<float>(&expected.value.value);
        uVar8 = wabt::Bitcast<unsigned_int,float>((float *)&local_34);
        local_38 = wabt::interp::Value::Get<float>(&actual.value);
        uVar9 = wabt::Bitcast<unsigned_int,float>((float *)&local_38);
        local_2d = uVar8 == uVar9;
        pEVar16 = extraout_RDX_04;
      }
      else if (expected.nan[0] == Canonical) {
        fVar17 = wabt::interp::Value::Get<float>(&actual.value);
        local_2d = IsCanonicalNan(fVar17);
        pEVar16 = extraout_RDX_03;
      }
      else if (expected.nan[0] == Arithmetic) {
        fVar17 = wabt::interp::Value::Get<float>(&actual.value);
        local_2d = IsArithmeticNan(fVar17);
        pEVar16 = extraout_RDX_02;
      }
      break;
    case I64:
      uVar11 = wabt::interp::Value::Get<unsigned_long>(&expected.value.value);
      uVar12 = wabt::interp::Value::Get<unsigned_long>(&actual.value);
      local_2d = uVar11 == uVar12;
      pEVar16 = extraout_RDX_01;
    }
    uVar8 = local_24;
    if (((local_2d & 1) == 0) && ((ok & 1U) != 0)) {
      uVar1 = (pAStack_20->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
      ExpectedValueToString_abi_cxx11_(&local_178,(spectest *)&expected,pEVar16);
      auVar18 = std::__cxx11::string::c_str();
      wabt::interp::TypedValueToString_abi_cxx11_(&local_198,(interp *)&actual,auVar18._8_8_);
      uVar15 = std::__cxx11::string::c_str();
      PrintError(this,uVar1,"mismatch in result %u of assert_return: expected %s, got %s",
                 (ulong)uVar8,auVar18._0_8_,uVar15);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
    }
    wabt::Result::Result((Result *)((long)&this_local + 4),(uint)((local_2d & 1) == 0));
    return (Result)this_local._4_4_;
  }
  __assert_fail("expected.value.type == actual.type || IsReference(expected.value.type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc"
                ,0x67e,
                "wabt::Result spectest::CommandRunner::CheckAssertReturnResult(const AssertReturnCommand *, int, ExpectedValue, TypedValue, bool)"
               );
}

Assistant:

wabt::Result CommandRunner::CheckAssertReturnResult(
    const AssertReturnCommand* command,
    int index,
    ExpectedValue expected,
    TypedValue actual,
    bool print_error) {
  assert(expected.value.type == actual.type ||
         IsReference(expected.value.type));
  bool ok = true;
  switch (expected.value.type) {
    case Type::I8:
    case Type::I16:
    case Type::I32:
      ok = expected.value.value.Get<u32>() == actual.value.Get<u32>();
      break;

    case Type::I64:
      ok = expected.value.value.Get<u64>() == actual.value.Get<u64>();
      break;

    case Type::F32:
      switch (expected.nan[0]) {
        case ExpectedNan::Arithmetic:
          ok = IsArithmeticNan(actual.value.Get<f32>());
          break;

        case ExpectedNan::Canonical:
          ok = IsCanonicalNan(actual.value.Get<f32>());
          break;

        case ExpectedNan::None:
          ok = Bitcast<u32>(expected.value.value.Get<f32>()) ==
               Bitcast<u32>(actual.value.Get<f32>());
          break;
      }
      break;

    case Type::F64:
      switch (expected.nan[0]) {
        case ExpectedNan::Arithmetic:
          ok = IsArithmeticNan(actual.value.Get<f64>());
          break;

        case ExpectedNan::Canonical:
          ok = IsCanonicalNan(actual.value.Get<f64>());
          break;

        case ExpectedNan::None:
          ok = Bitcast<u64>(expected.value.value.Get<f64>()) ==
               Bitcast<u64>(actual.value.Get<f64>());
          break;
      }
      break;

    case Type::V128: {
      // Compare each lane as if it were its own value.
      for (int lane = 0; lane < LaneCountFromType(expected.lane_type); ++lane) {
        ExpectedValue lane_expected = GetLane(expected, lane);
        TypedValue lane_actual = GetLane(actual, expected.lane_type, lane);

        if (Failed(CheckAssertReturnResult(command, index, lane_expected,
                                           lane_actual, false))) {
          PrintError(command->line,
                     "mismatch in lane %u of result %u of assert_return: "
                     "expected %s, got %s",
                     lane, index, ExpectedValueToString(lane_expected).c_str(),
                     TypedValueToString(lane_actual).c_str());
          ok = false;
        }
      }
      break;
    }

    case Type::FuncRef:
      // A funcref expectation only requires that the reference be a function,
      // but it doesn't check the actual index.
      ok = (actual.type == Type::FuncRef);
      break;

    case Type::ExternRef:
      ok = expected.value.value.Get<Ref>() == actual.value.Get<Ref>();
      break;

    default:
      WABT_UNREACHABLE;
  }

  if (!ok && print_error) {
    PrintError(command->line,
               "mismatch in result %u of assert_return: expected %s, got %s",
               index, ExpectedValueToString(expected).c_str(),
               TypedValueToString(actual).c_str());
  }
  return ok ? wabt::Result::Ok : wabt::Result::Error;
}